

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O1

int __thiscall gl4cts::GL40TestPackage::init(GL40TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ClipControlTests *this_00;
  TextureBarrierTests *this_01;
  ExtParameters extParams;
  ExtParameters local_20;
  
  gl3cts::GL33TestPackage::init(&this->super_GL33TestPackage,ctx);
  local_20.glslVersion = GLSL_VERSION_400;
  local_20.extType = EXTENSIONTYPE_NONE;
  pTVar1 = (TestNode *)operator_new(0x80);
  glcts::DrawElementsBaseVertexTests::DrawElementsBaseVertexTests
            ((DrawElementsBaseVertexTests *)pTVar1,
             &((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
               super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  GPUShaderFP64Tests::GPUShaderFP64Tests
            ((GPUShaderFP64Tests *)pTVar1,
             &((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
               super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureGatherTests::TextureGatherTests
            ((TextureGatherTests *)pTVar1,
             &((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
               super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  glcts::DrawIndirectTestsGL40::DrawIndirectTestsGL40
            ((DrawIndirectTestsGL40 *)pTVar1,
             &((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
               super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (ClipControlTests *)operator_new(0x80);
  ClipControlTests::ClipControlTests
            (this_00,&((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
                       super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context,
             API_GL_ARB_clip_control);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderSubroutineTests::ShaderSubroutineTests
            ((ShaderSubroutineTests *)pTVar1,
             &((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
               super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (TextureBarrierTests *)operator_new(0x80);
  TextureBarrierTests::TextureBarrierTests
            (this_01,&((this->super_GL33TestPackage).super_GL32TestPackage.super_GL31TestPackage.
                       super_GL30TestPackage.super_TestPackage.m_packageCtx)->m_context,
             API_GL_ARB_texture_barrier);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void GL40TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL33TestPackage::init();

	try
	{
		glcts::ExtParameters extParams(glu::GLSL_VERSION_400, glcts::EXTENSIONTYPE_NONE);
		addChild(new glcts::DrawElementsBaseVertexTests(getContext(), extParams));
		addChild(new gl4cts::GPUShaderFP64Tests(getContext()));
		addChild(new gl4cts::TextureGatherTests(getContext()));
		addChild(new glcts::DrawIndirectTestsGL40(getContext()));
		addChild(new gl4cts::ClipControlTests(getContext(), gl4cts::ClipControlTests::API_GL_ARB_clip_control));
		addChild(new gl4cts::ShaderSubroutineTests(getContext()));
		addChild(
			new gl4cts::TextureBarrierTests(getContext(), gl4cts::TextureBarrierTests::API_GL_ARB_texture_barrier));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}